

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LennardJonesAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::LennardJonesAtomTypesSectionParser::parseLine
          (LennardJonesAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  AtomType *pAVar4;
  RealType RVar5;
  RealType RVar6;
  string atomTypeName;
  LennardJonesAdapter lj;
  StringTokenizer tokenizer;
  string local_c0;
  double local_a0;
  string local_98;
  StringTokenizer local_78;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0," ;\t\n\r",(allocator<char> *)&local_98);
  StringTokenizer::StringTokenizer(&local_78,line,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  iVar3 = StringTokenizer::countTokens(&local_78);
  if (iVar3 < 3) {
    snprintf(painCave.errMsg,2000,
             "LennardJonesAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_c0,&local_78);
    pAVar4 = ForceField::getAtomType(ff,&local_c0);
    if (pAVar4 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "LennardJonesAtomTypesSectionParser Error: Atom Type [%s] is not created yet\n",
               local_c0._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    else {
      RVar5 = StringTokenizer::nextTokenAsDouble(&local_78);
      RVar6 = StringTokenizer::nextTokenAsDouble(&local_78);
      dVar1 = (this->options_->EnergyUnitScaling).data_;
      local_a0 = RVar6 * (this->options_->DistanceUnitScaling).data_;
      bVar2 = StringTokenizer::hasMoreTokens(&local_78);
      if (bVar2) {
        StringTokenizer::nextToken_abi_cxx11_(&local_98,&local_78);
        bVar2 = std::operator==(&local_98,"soft");
        std::__cxx11::string::~string((string *)&local_98);
      }
      else {
        bVar2 = false;
      }
      local_98._M_dataplus._M_p = (pointer)pAVar4;
      LennardJonesAdapter::makeLennardJones
                ((LennardJonesAdapter *)&local_98,local_a0,RVar5 * dVar1,bVar2);
    }
    std::__cxx11::string::~string((string *)&local_c0);
  }
  StringTokenizer::~StringTokenizer(&local_78);
  return;
}

Assistant:

void LennardJonesAtomTypesSectionParser::parseLine(ForceField& ff,
                                                     const std::string& line,
                                                     int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in LennardJonesAtomTypesSectionParser, a line at least contains 3 tokens
    // atomTypeName, epsilon and sigma
    if (nTokens < 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LennardJonesAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);

      if (atomType != NULL) {
        RealType epsilon = tokenizer.nextTokenAsDouble();
        RealType sigma   = tokenizer.nextTokenAsDouble();
        bool isSoft      = false;

        epsilon *= options_.getEnergyUnitScaling();
        sigma *= options_.getDistanceUnitScaling();

        if (tokenizer.hasMoreTokens()) {
          std::string pot_type = tokenizer.nextToken();
          if (pot_type == "soft") { isSoft = true; }
        }

        LennardJonesAdapter lj = LennardJonesAdapter(atomType);
        lj.makeLennardJones(sigma, epsilon, isSoft);

      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "LennardJonesAtomTypesSectionParser Error: Atom Type [%s] is not "
            "created yet\n",
            atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }